

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_dyn_vector.cpp
# Opt level: O2

void msd_D<std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_long>
               (uchar **strings,size_t n,size_t depth,
               vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *buckets)

{
  size_t n_00;
  uint j;
  long lVar1;
  pointer *pppuVar2;
  size_t __n;
  value_type *__x;
  uint j_1;
  uint i;
  uchar **__x_00;
  long lVar3;
  ulong uVar4;
  unsigned_long uVar5;
  array<unsigned_long,_256UL> bucketsize;
  
  if (n < 0x20) {
    insertion_sort(strings,(int)n,depth);
    return;
  }
  __x_00 = strings;
  for (uVar4 = 0; uVar4 < (n & 0xffffffffffffffe0); uVar4 = uVar4 + 0x20) {
    for (lVar1 = 0; lVar1 != 0x20; lVar1 = lVar1 + 1) {
      *(uchar *)((long)bucketsize._M_elems + lVar1) = __x_00[lVar1][depth];
    }
    __x = __x_00;
    for (lVar1 = 0; lVar1 != 0x20; lVar1 = lVar1 + 1) {
      std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::push_back
                (buckets + *(byte *)((long)bucketsize._M_elems + lVar1),__x);
      __x = __x + 1;
    }
    __x_00 = __x_00 + 0x20;
  }
  for (; uVar4 < n; uVar4 = uVar4 + 1) {
    std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::push_back
              (buckets + (*__x_00)[depth],__x_00);
    __x_00 = __x_00 + 1;
  }
  pppuVar2 = &(buckets->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
              _M_impl.super__Vector_impl_data._M_finish;
  for (lVar1 = 0; lVar1 != 0x100; lVar1 = lVar1 + 1) {
    bucketsize._M_elems[lVar1] =
         (long)*pppuVar2 - (long)((_Vector_impl_data *)(pppuVar2 + -1))->_M_start >> 3;
    pppuVar2 = pppuVar2 + 3;
  }
  pppuVar2 = &(buckets->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
              _M_impl.super__Vector_impl_data._M_finish;
  lVar3 = 0;
  for (lVar1 = 0; lVar1 != 0x100; lVar1 = lVar1 + 1) {
    uVar5 = bucketsize._M_elems[lVar1];
    if (uVar5 != 0) {
      __n = (long)*pppuVar2 - (long)((_Vector_impl_data *)(pppuVar2 + -1))->_M_start;
      if (__n != 0) {
        memmove(strings + lVar3,((_Vector_impl_data *)(pppuVar2 + -1))->_M_start,__n);
      }
      lVar3 = lVar3 + uVar5;
    }
    pppuVar2 = pppuVar2 + 3;
  }
  for (lVar1 = 8; lVar1 != 0x1808; lVar1 = lVar1 + 0x18) {
    lVar3 = *(long *)((long)buckets + lVar1 + -8);
    if (*(long *)((long)&(buckets->
                         super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
                         _M_impl.super__Vector_impl_data._M_start + lVar1) != lVar3) {
      *(long *)((long)&(buckets->
                       super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
                       _M_impl.super__Vector_impl_data._M_start + lVar1) = lVar3;
    }
  }
  uVar5 = bucketsize._M_elems[0];
  for (lVar1 = 1; lVar1 != 0x100; lVar1 = lVar1 + 1) {
    n_00 = bucketsize._M_elems[lVar1];
    if (n_00 != 0) {
      msd_D<std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_long>
                (strings + uVar5,n_00,depth + 1,buckets);
      uVar5 = uVar5 + n_00;
    }
  }
  return;
}

Assistant:

static void
msd_D(unsigned char** strings, size_t n, size_t depth, Bucket* buckets)
{
	if (n < 32) {
		insertion_sort(strings, n, depth);
		return;
	}
	// Use a small cache to reduce memory stalls.
	size_t i=0;
	for (; i < n-n%32; i+=32) {
		unsigned char cache[32];
		for (unsigned j=0; j < 32; ++j) {
			cache[j] = strings[i+j][depth];
		}
		for (unsigned j=0; j < 32; ++j) {
			buckets[cache[j]].push_back(strings[i+j]);
		}
	}
	for (; i < n; ++i) {
		buckets[strings[i][depth]].push_back(strings[i]);
	}
	std::array<BucketsizeType, 256> bucketsize;
	for (unsigned i=0; i < 256; ++i) {
		bucketsize[i] = buckets[i].size();
	}
	size_t pos = 0;
	for (unsigned i=0; i < 256; ++i) {
		if (bucketsize[i] == 0) continue;
		copy(buckets[i], strings+pos);
		pos += bucketsize[i];
	}
	for (unsigned i=0; i < 256; ++i) {
		buckets[i].clear();
	}
	pos = bucketsize[0];
	for (unsigned i=1; i < 256; ++i) {
		if (bucketsize[i] == 0) continue;
		msd_D<Bucket, BucketsizeType>(strings+pos, bucketsize[i], depth+1, buckets);
		pos += bucketsize[i];
	}
}